

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O0

void __thiscall adios2::helper::CommImplMPI::Free(CommImplMPI *this,string *hint)

{
  long in_RDI;
  MPI_Comm mpiComm;
  string *in_stack_00000138;
  int in_stack_00000144;
  undefined8 local_18 [3];
  
  if (((*(undefined **)(in_RDI + 8) != &ompi_mpi_comm_null) &&
      (*(undefined **)(in_RDI + 8) != &ompi_mpi_comm_world)) &&
     (*(undefined **)(in_RDI + 8) != &ompi_mpi_comm_self)) {
    local_18[0] = *(undefined8 *)(in_RDI + 8);
    *(undefined **)(in_RDI + 8) = &ompi_mpi_comm_null;
    MPI_Comm_free(local_18);
    anon_unknown_1::CheckMPIReturn(in_stack_00000144,in_stack_00000138);
  }
  return;
}

Assistant:

void CommImplMPI::Free(const std::string &hint)
{
    if (m_MPIComm != MPI_COMM_NULL && m_MPIComm != MPI_COMM_WORLD && m_MPIComm != MPI_COMM_SELF)
    {
        MPI_Comm mpiComm = m_MPIComm;
        m_MPIComm = MPI_COMM_NULL; // prevent freeing a second time
        CheckMPIReturn(MPI_Comm_free(&mpiComm), hint);
    }
}